

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O2

void Aig_ManReprStart(Aig_Man_t *p,int nIdMax)

{
  uint __line;
  Aig_Obj_t **ppAVar1;
  char *__assertion;
  
  if (p->nObjs[4] == 0) {
    if (p->pReprs == (Aig_Obj_t **)0x0) {
      p->nReprsAlloc = nIdMax;
      ppAVar1 = (Aig_Obj_t **)calloc(1,(long)nIdMax << 3);
      p->pReprs = ppAVar1;
      return;
    }
    __assertion = "p->pReprs == NULL";
    __line = 0x30;
  }
  else {
    __assertion = "Aig_ManBufNum(p) == 0";
    __line = 0x2f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRepr.c"
                ,__line,"void Aig_ManReprStart(Aig_Man_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the array of representatives.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Aig_ManReprStart( Aig_Man_t * p, int nIdMax )
{
    assert( Aig_ManBufNum(p) == 0 );
    assert( p->pReprs == NULL );
    p->nReprsAlloc = nIdMax;
    p->pReprs = ABC_ALLOC( Aig_Obj_t *, p->nReprsAlloc );
    memset( p->pReprs, 0, sizeof(Aig_Obj_t *) * p->nReprsAlloc );
}